

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_decompress.c
# Opt level: O3

libdeflate_result
dispatch_decomp(libdeflate_decompressor *d,void *in,size_t in_nbytes,void *out,
               size_t out_nbytes_avail,size_t *actual_in_nbytes_ret,size_t *actual_out_nbytes_ret)

{
  libdeflate_result lVar1;
  code *UNRECOVERED_JUMPTABLE;
  
  if (libdeflate_x86_cpu_features == 0) {
    libdeflate_init_x86_cpu_features();
  }
  UNRECOVERED_JUMPTABLE = deflate_decompress_bmi2;
  if ((libdeflate_x86_cpu_features & 0x10) == 0) {
    UNRECOVERED_JUMPTABLE = deflate_decompress_default;
  }
  decompress_impl = UNRECOVERED_JUMPTABLE;
  lVar1 = (*UNRECOVERED_JUMPTABLE)
                    (d,in,in_nbytes,out,out_nbytes_avail,actual_in_nbytes_ret,actual_out_nbytes_ret)
  ;
  return lVar1;
}

Assistant:

static enum libdeflate_result
dispatch_decomp(struct libdeflate_decompressor *d,
		const void *in, size_t in_nbytes,
		void *out, size_t out_nbytes_avail,
		size_t *actual_in_nbytes_ret, size_t *actual_out_nbytes_ret)
{
	decompress_func_t f = arch_select_decompress_func();

	if (f == NULL)
		f = DEFAULT_IMPL;

	decompress_impl = f;
	return f(d, in, in_nbytes, out, out_nbytes_avail,
		 actual_in_nbytes_ret, actual_out_nbytes_ret);
}